

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnumeric.cpp
# Opt level: O0

int qFpClassify(double val)

{
  int iVar1;
  
  iVar1 = qt_fpclassify(1.20789366721526e-317);
  return iVar1;
}

Assistant:

Q_CORE_EXPORT int qFpClassify(double val) { return qt_fpclassify(val); }